

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O1

void __thiscall bwtil::cw_bwt::initStructures(cw_bwt *this)

{
  ContextAutomata *this_00;
  undefined8 *puVar1;
  byte s;
  pointer pvVar2;
  void *pvVar3;
  pointer puVar4;
  ulint uVar5;
  pointer pDVar6;
  long lVar7;
  pointer pPVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long *plVar19;
  ostream *poVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  ulong uVar24;
  cw_bwt *pcVar25;
  size_type __n;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  allocator_type local_111;
  cw_bwt *local_110;
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  local_108;
  undefined8 *local_f0;
  double local_e8;
  double local_e0;
  undefined1 local_d8 [40];
  pointer puStack_b0;
  pointer local_a8;
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  local_a0;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_88;
  ulint local_70;
  undefined1 uStack_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  undefined8 uStack_5f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 extraout_var [56];
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&local_108,this->number_of_contexts,&local_111);
  pvVar2 = (this->frequencies).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8._8_8_ =
       (this->frequencies).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8._16_8_ =
       (this->frequencies).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.
  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._0_4_ = SUB84(pvVar2,0);
  local_d8._4_4_ = (undefined4)((ulong)pvVar2 >> 0x20);
  local_108.
  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_d8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_108);
  __n = this->number_of_contexts;
  local_110 = this;
  if (__n != 0) {
    lVar22 = 0x10;
    uVar24 = 0;
    do {
      pcVar25 = local_110;
      local_108.
      super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                 (ulong)local_110->sigma,(value_type *)&local_108,(allocator_type *)&local_111);
      pvVar2 = (pcVar25->frequencies).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = *(void **)((long)pvVar2 + lVar22 + -0x10);
      puVar1 = (undefined8 *)((long)pvVar2 + lVar22 + -0x10);
      *puVar1 = CONCAT44(local_d8._4_4_,local_d8._0_4_);
      puVar1[1] = local_d8._8_8_;
      *(undefined8 *)
       ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar22) = local_d8._16_8_;
      local_d8._16_8_ = (pointer)0x0;
      local_d8[0] = '\0';
      local_d8[1] = '\0';
      local_d8[2] = '\0';
      local_d8[3] = '\0';
      local_d8._4_4_ = 0;
      local_d8._8_8_ = SUB168(ZEXT816(0),4);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
      }
      if ((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
      }
      uVar24 = uVar24 + 1;
      __n = local_110->number_of_contexts;
      lVar22 = lVar22 + 0x18;
    } while (uVar24 < __n);
  }
  pcVar25 = local_110;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,__n,
             (allocator_type *)&local_108);
  (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
  puVar4 = (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(local_d8._4_4_,local_d8._0_4_);
  (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8._4_4_ = 0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  if ((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
  }
  if (pcVar25->number_of_contexts != 0) {
    puVar4 = (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar24 = 0;
    do {
      puVar4[uVar24] = 0;
      uVar24 = uVar24 + 1;
    } while (uVar24 < pcVar25->number_of_contexts);
  }
  if (pcVar25->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n*** Scanning input file to compute context frequencies ***",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    plVar19 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
    std::ostream::put((char)plVar19);
    std::ostream::flush();
  }
  iVar15 = (*pcVar25->bwIt->_vptr_BackwardIterator[4])();
  if ((char)iVar15 == '\0') {
    this_00 = &pcVar25->ca;
    iVar15 = -1;
    uVar24 = 0;
    do {
      uVar16 = (*pcVar25->bwIt->_vptr_BackwardIterator[3])();
      s = (byte)(pcVar25->ca).remapping.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16 & 0xff];
      uVar27 = (ulong)s;
      puVar4 = (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + (pcVar25->ca).current_state;
      *puVar4 = *puVar4 + 1;
      uVar5 = (pcVar25->ca).current_state;
      pvVar2 = (pcVar25->frequencies).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = *(long *)&pvVar2[uVar5].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data;
      uVar21 = (long)pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar22 >> 3;
      if (uVar21 <= uVar27) goto LAB_001121a7;
      plVar19 = (long *)(lVar22 + uVar27 * 8);
      *plVar19 = *plVar19 + 1;
      ContextAutomata::goTo(this_00,s);
      iVar17 = (int)(uVar24 / pcVar25->n);
      if (((iVar15 < iVar17) && (iVar17 % 5 == 0)) && (pcVar25->verbose == true)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
        pcVar25 = local_110;
        std::ostream::put((char)poVar20);
        std::ostream::flush();
        iVar15 = iVar17;
      }
      iVar17 = (*pcVar25->bwIt->_vptr_BackwardIterator[4])();
      uVar24 = uVar24 + 100;
    } while ((char)iVar17 == '\0');
  }
  puVar4 = (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + (pcVar25->ca).current_state;
  *puVar4 = *puVar4 + 1;
  uVar5 = (pcVar25->ca).current_state;
  pvVar2 = (pcVar25->frequencies).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    *puVar4 = *puVar4 + 1;
    computeEmpiricalEntropy(pcVar25);
    if (pcVar25->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Done.\n",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    uVar21 = (pcVar25->n * 10) / pcVar25->number_of_contexts;
    local_f0 = (undefined8 *)operator_new(0xa8);
    *local_f0 = 0;
    local_f0[1] = 0;
    local_f0[2] = 0;
    local_f0[3] = 0;
    local_f0[4] = 0;
    local_f0[5] = 0;
    local_f0[6] = 0;
    local_f0[7] = 0;
    local_f0[8] = 0;
    local_f0[9] = 0;
    local_f0[10] = 0;
    local_f0[0xb] = 0;
    local_f0[0xc] = 0;
    local_f0[0xd] = 0;
    local_f0[0xe] = 0;
    local_f0[0xf] = 0;
    local_f0[0xd] = 0;
    local_f0[0xe] = 0;
    local_f0[0xf] = 0;
    local_f0[0x10] = 0;
    local_f0[0x11] = 0;
    local_f0[0x12] = 0;
    local_f0[0x13] = 0;
    local_f0[0x14] = 0;
    uVar24 = pcVar25->number_of_contexts;
    if (uVar24 != 0) {
      puVar4 = (pcVar25->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar27 = 0;
      do {
        uVar26 = puVar4[uVar27];
        plVar19 = local_f0 + 0x14;
        if (uVar26 < uVar21) {
          uVar26 = uVar26 / (uVar21 / 0x14) & 0xffffffff;
          if (0x14 < uVar26) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar26,0x15);
          }
          plVar19 = local_f0 + uVar26;
        }
        *plVar19 = *plVar19 + 1;
        uVar27 = uVar27 + 1;
      } while (uVar24 != uVar27);
    }
    uVar24 = pcVar25->n / uVar24;
    if (pcVar25->verbose != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," Expected context size (if uniform text) is ",0x2c);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," characters",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
    }
    auVar11._8_8_ = in_XMM2_Qb;
    auVar11._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar11,uVar24 + 1);
    auVar30._0_8_ = log2(auVar11._0_8_);
    auVar30._8_56_ = extraout_var;
    iVar15 = vcvttsd2usi_avx512f(auVar30._0_16_);
    auVar29._0_8_ = (double)(int)(0x100 / (ulong)(iVar15 + 1));
    auVar29._8_8_ = in_XMM2_Qb;
    auVar11 = vsqrtsd_avx(auVar29,auVar29);
    uVar18 = vcvttsd2usi_avx512f(auVar11);
    uVar16 = 2;
    if (2 < uVar18) {
      uVar16 = uVar18;
    }
    auVar12._8_8_ = in_XMM2_Qb;
    auVar12._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar12,(int)(uVar24 >> 0xc) + 1);
    local_e0 = log2(auVar11._0_8_);
    pcVar25 = local_110;
    auVar13._8_8_ = in_XMM2_Qb;
    auVar13._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar13,uVar16);
    local_e8 = log2(auVar11._0_8_);
    if (pcVar25->verbose != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 " Expected worst-case packed B-tree height (if uniform text) is ",0x3f);
      auVar31._0_8_ = local_e0 / local_e8;
      auVar31._8_8_ = 0;
      uVar9 = vcmpsd_avx512f(ZEXT816(0),auVar31,1);
      bVar10 = (bool)((byte)uVar9 & 1);
      poVar20 = std::ostream::_M_insert<double>
                          ((double)((ulong)bVar10 * (long)auVar31._0_8_ +
                                   (ulong)!bVar10 * 0x3ff0000000000000));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
    }
    if (pcVar25->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\n*** Creating data structures (dynamic compressed strings and partial sums) ***",
                 0x4f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      plVar19 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
      std::ostream::put((char)plVar19);
      std::ostream::flush();
    }
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
              *)&local_108,pcVar25->number_of_contexts,(allocator_type *)&local_111);
    pDVar6 = (pcVar25->dynStrings).
             super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8._8_8_ =
         (pcVar25->dynStrings).
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._16_8_ =
         (pcVar25->dynStrings).
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pcVar25->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pcVar25->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (pcVar25->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._0_4_ = SUB84(pDVar6,0);
    local_d8._4_4_ = (undefined4)((ulong)pDVar6 >> 0x20);
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)local_d8);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)&local_108);
    if (pcVar25->number_of_contexts != 0) {
      local_e8 = (double)CONCAT44(local_e8._4_4_,0xffffffff);
      lVar28 = 0x68;
      lVar22 = 0;
      uVar24 = 0;
      dVar23 = 0.0;
      do {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(((pcVar25->frequencies).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar22));
        DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
                  ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)local_d8,
                   &local_48);
        pDVar6 = (local_110->dynStrings).
                 super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)pDVar6 + lVar28 + -0x68) = local_d8._0_4_;
        pvVar3 = *(void **)((long)pDVar6 + lVar28 + -0x60);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x60);
        *puVar1 = local_d8._8_8_;
        puVar1[1] = local_d8._16_8_;
        *(undefined8 *)((long)pDVar6 + lVar28 + -0x50) = local_d8._24_8_;
        local_d8._8_8_ = (pointer)0x0;
        local_d8._16_8_ = SUB168(ZEXT816(0),4);
        local_d8._24_8_ = (pointer)0x0;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        pvVar3 = *(void **)((long)pDVar6 + lVar28 + -0x48);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x48);
        *puVar1 = local_d8._32_8_;
        puVar1[1] = puStack_b0;
        *(pointer *)((long)pDVar6 + lVar28 + -0x38) = local_a8;
        register0x00001200 = ZEXT816(0) << 0x20;
        local_a8 = (pointer)0x0;
        local_e0 = dVar23;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x30);
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)pDVar6 + lVar28 + -0x20);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x30);
        *puVar1 = local_a0.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1[1] = local_a0.
                    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((long)pDVar6 + lVar28 + -0x20) =
             local_a0.
             super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a0.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ::~vector(&local_108);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x18);
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)pDVar6 + lVar28 + -8);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar28 + -0x18);
        *puVar1 = local_88.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1[1] = local_88.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((long)pDVar6 + lVar28 + -8) =
             local_88.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *)&local_108);
        puVar1 = (undefined8 *)
                 ((long)&(pDVar6->child0).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar28 + 1);
        *puVar1 = CONCAT17(uStack_60,uStack_67);
        puVar1[1] = uStack_5f;
        *(ulint *)(&pDVar6->number_of_internal_nodes + lVar28) = local_70;
        *(ulong *)&(((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    (&pDVar6->number_of_internal_nodes + lVar28 + 8))->
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl =
             CONCAT71(uStack_67,uStack_68);
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::~vector(&local_88);
        std::
        vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ::~vector(&local_a0);
        if ((pointer)local_d8._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._32_8_);
        }
        dVar23 = local_e0;
        if ((pointer)local_d8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._8_8_);
        }
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        pvVar2 = (local_110->frequencies).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = *(long *)((long)&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar22);
        if (*(long *)((long)&(pvVar2->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar22) != lVar7) {
          *(long *)((long)&(pvVar2->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish + lVar22) = lVar7;
        }
        iVar15 = (int)(uVar24 / local_110->number_of_contexts);
        if (((local_e8._0_4_ < iVar15) && (iVar15 % 10 == 0)) && (local_110->verbose == true)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"% done.",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
          std::ostream::put((char)poVar20);
          std::ostream::flush();
          local_e8 = (double)CONCAT44(local_e8._4_4_,iVar15);
        }
        dVar23 = (double)((long)dVar23 + 1);
        uVar24 = uVar24 + 100;
        lVar22 = lVar22 + 0x18;
        lVar28 = lVar28 + 0x88;
        pcVar25 = local_110;
      } while ((ulong)dVar23 < local_110->number_of_contexts);
    }
    computeActualEntropy(pcVar25);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_108,
               pcVar25->number_of_contexts,(allocator_type *)&local_111);
    pPVar8 = (pcVar25->partial_sums).
             super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8._8_8_ =
         (pcVar25->partial_sums).
         super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_d8._16_8_ =
         (pcVar25->partial_sums).
         super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pcVar25->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pcVar25->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (pcVar25->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._0_4_ = SUB84(pPVar8,0);
    local_d8._4_4_ = (undefined4)((ulong)pPVar8 >> 0x20);
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)local_d8);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_108);
    if (pcVar25->number_of_contexts != 0) {
      lVar22 = 4;
      uVar24 = 0;
      do {
        PartialSums::PartialSums
                  ((PartialSums *)local_d8,pcVar25->sigma,
                   (pcVar25->lengths).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar24]);
        pPVar8 = (pcVar25->partial_sums).
                 super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)pPVar8 + lVar22 * 8 + -0x20);
        *puVar1 = CONCAT44(local_d8._4_4_,local_d8._0_4_);
        puVar1[1] = local_d8._8_8_;
        pvVar3 = *(void **)((long)pPVar8 + lVar22 * 8 + -0x10);
        puVar1 = (undefined8 *)((long)pPVar8 + lVar22 * 8 + -0x10);
        *puVar1 = local_d8._16_8_;
        puVar1[1] = local_d8._24_8_;
        *(undefined8 *)(&pPVar8->sigma + lVar22 * 8) = local_d8._32_8_;
        local_d8._16_8_ = (pointer)0x0;
        local_d8._24_8_ = (pointer)0x0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = puStack_b0;
        stack0xffffffffffffff48 = auVar14 << 0x40;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        if ((pointer)local_d8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._16_8_);
        }
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 5;
      } while (uVar24 < pcVar25->number_of_contexts);
    }
    if (pcVar25->verbose != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n k-th order empirical entropy of the text is ",0x2e);
      poVar20 = std::ostream::_M_insert<double>(pcVar25->Hk);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," bits per symbol used (only compressed text): ",0x2e);
      poVar20 = std::ostream::_M_insert<double>(pcVar25->bits_per_symbol);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
    }
    if (pcVar25->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nData structures created.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    operator_delete(local_f0);
    return;
  }
  uVar27 = 0;
  uVar21 = 0;
LAB_001121a7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar27,
             uVar21);
}

Assistant:

void initStructures(){

		frequencies = vector<vector<ulint> >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			frequencies[i] = vector<ulint>(sigma,0);

		lengths = vector<ulint>(number_of_contexts);

		for(ulint i=0;i<number_of_contexts;i++)
			lengths[i]=0;

		symbol s;

		ulint symbols_read=0;

		if(verbose) cout << "\n*** Scanning input file to compute context frequencies ***" << endl << endl;

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			s = ca.ASCIItoCode( bwIt->read() );//this symbol has as context the current state of the automata

			lengths[ ca.currentState() ]++;//new symbol in this context:increment

			frequencies[ ca.currentState() ].at(s) = frequencies[ ca.currentState() ].at(s)+1;//increment the frequency of s in the context

			ca.goTo(s);

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}
			symbols_read++;

		}

		lengths[ ca.currentState() ]++;//first context in the text: will contain only terminator
		frequencies[ ca.currentState() ].at(0)++;//terminator

		computeEmpiricalEntropy();

		if(verbose) cout << " Done.\n" << endl;

		//99 intervals [i,i+100M/100] and one final interval i>100M

		//statistics:
		uint number_of_intervals = 20;
		ulint max_len = (10*n)/number_of_contexts;
		ulint step = max_len / number_of_intervals;
		ulint tot_intervals = number_of_intervals+1;

		vector<ulint> stats = vector<ulint>(tot_intervals,0);

		ulint max=0;
		for(ulint i=0;i<number_of_contexts;i++)
			if(lengths[i]>max)
				max=lengths[i];

		for(ulint i=0;i<number_of_contexts;i++){

			if(lengths[i]>=max_len)
				stats.at(tot_intervals-1) = stats.at(tot_intervals-1)+1;
			else{

				uint pos=lengths[i]/step;
				stats.at(pos) = stats.at(pos)+1;

			}

		}

		ulint exp_context_length = n/number_of_contexts;

		//if(verbose) cout << " Largest context has " << max << " characters" << endl;
		if(verbose) cout << " Expected context size (if uniform text) is " << exp_context_length << " characters" << endl;

		//compute expected packed B-tree height

		{

			uint nr_of_leaves = exp_context_length/W_leafs + 1;
			uint log2n = log2(exp_context_length+1);
			uint d = W_nodes/(log2n+1);
			uint b = sqrt(d); //worst-case tree fanout
			if(b<=1) b=2;
			double exp_height = (log2(nr_of_leaves)/log2(b));
			if(exp_height<=0) exp_height = 1;

			if(verbose) cout << " Expected worst-case packed B-tree height (if uniform text) is " << exp_height << endl ;

		}

		/*if(verbose) cout << " Context length statistics: " << endl;

		if(verbose){

			for(uint i=0;i<tot_intervals-1;i++)
				cout << " [" << i*step << ", " << (i+1)*step << "[ -> " << stats.at(i)<<endl;

			cout << " [ " << max_len <<", inf [ -> " << stats.at(tot_intervals-1)<<endl;

		}*/


		if(verbose) cout << "\n*** Creating data structures (dynamic compressed strings and partial sums) ***" << endl << endl;

		perc=0;
		last_perc=-1;

		dynStrings = vector<dynamic_string_t >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++){

			dynStrings[i] = dynamic_string_t(frequencies[i]);
			frequencies[i].clear();//free memory

			perc = (100*i)/number_of_contexts;

			if(perc>last_perc and (perc%10)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

		}

		computeActualEntropy();

		partial_sums = vector<PartialSums>(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			partial_sums[i] = PartialSums(sigma,lengths[i]);

		if(verbose){

			cout << "\n k-th order empirical entropy of the text is " << empiricalEntropy() << endl;
			cout << " bits per symbol used (only compressed text): " << actualEntropy() << endl;

		}

		if(verbose) cout << "\nData structures created." << endl;

	}